

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void tests::nested_to_dot(void)

{
  ostream *poVar1;
  _Vector_base<N_*,_std::allocator<N_*>_> *this;
  NS *local_40;
  NS *local_38;
  NS *local_28;
  
  test_graphs::simple();
  test_graphs::two_nested();
  test_graphs::double_nested();
  poVar1 = std::operator<<((ostream *)&std::cout,"digraph g {");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"compound=true;");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"overlap = false;\nsplines = true;");
  std::endl<char,std::char_traits<char>>(poVar1);
  draw_nested(local_28);
  draw_nested(local_38);
  draw_nested(local_40);
  poVar1 = std::operator<<((ostream *)&std::cout,"}");
  std::endl<char,std::char_traits<char>>(poVar1);
  this = (_Vector_base<N_*,_std::allocator<N_*>_> *)NS::clear(local_28);
  if (this != (_Vector_base<N_*,_std::allocator<N_*>_> *)0x0) {
    std::_Vector_base<N_*,_std::allocator<N_*>_>::~_Vector_base(this);
  }
  operator_delete(this,0x18);
  NS::clear(local_38);
  NS::clear(local_40);
  return;
}

Assistant:

void nested_to_dot() {
        auto [f, _] = test_graphs::simple();
        auto [g] = test_graphs::two_nested();
        auto [h] = test_graphs::double_nested();

        cout << "digraph g {" << endl;
        cout << "compound=true;" << endl;
        cout << "overlap = false;\nsplines = true;" << endl;
        draw_nested(f);
        draw_nested(g);
        draw_nested(h);
        cout << "}" << endl;

        delete f->clear(), g->clear(), h->clear();
    }